

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

ZSTD_DCtx * ZSTD_createDCtx_internal(ZSTD_customMem customMem)

{
  ZSTD_customMem customMem_00;
  size_t in_stack_00000008;
  long in_stack_00000010;
  ZSTD_DCtx *dctx;
  undefined8 in_stack_ffffffffffffffe0;
  undefined8 *puVar1;
  void *in_stack_fffffffffffffff0;
  ZSTD_DCtx *local_8;
  
  puVar1 = &stack0x00000008;
  if ((in_stack_00000008 == 0) == (in_stack_00000010 == 0)) {
    customMem_00.customFree = (ZSTD_freeFunction)puVar1;
    customMem_00.customAlloc = (ZSTD_allocFunction)in_stack_ffffffffffffffe0;
    customMem_00.opaque = in_stack_fffffffffffffff0;
    local_8 = (ZSTD_DCtx *)ZSTD_customMalloc(in_stack_00000008,customMem_00);
    if (local_8 == (ZSTD_DCtx *)0x0) {
      local_8 = (ZSTD_DCtx *)0x0;
    }
    else {
      (local_8->customMem).customAlloc = (ZSTD_allocFunction)*puVar1;
      (local_8->customMem).customFree = (ZSTD_freeFunction)puVar1[1];
      (local_8->customMem).opaque = (void *)puVar1[2];
      ZSTD_initDCtx_internal((ZSTD_DCtx *)0x2f2d03);
    }
  }
  else {
    local_8 = (ZSTD_DCtx *)0x0;
  }
  return local_8;
}

Assistant:

static ZSTD_DCtx* ZSTD_createDCtx_internal(ZSTD_customMem customMem) {
    if ((!customMem.customAlloc) ^ (!customMem.customFree)) return NULL;

    {   ZSTD_DCtx* const dctx = (ZSTD_DCtx*)ZSTD_customMalloc(sizeof(*dctx), customMem);
        if (!dctx) return NULL;
        dctx->customMem = customMem;
        ZSTD_initDCtx_internal(dctx);
        return dctx;
    }
}